

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O2

void __thiscall MetricsDiscovery::MDHelper::DeactivateMetricSet(MDHelper *this)

{
  int iVar1;
  
  if (((this->m_Initialized == true) && (this->m_Activated == true)) &&
     (this->m_MetricSet != (IMetricSetLatest *)0x0)) {
    iVar1 = (**(code **)(*(long *)this->m_MetricSet + 0x38))();
    this->m_Activated = iVar1 != 0;
  }
  return;
}

Assistant:

void MDHelper::DeactivateMetricSet()
{
    if( !m_Initialized || !m_Activated || !m_MetricSet )
    {
        DebugPrint("Can't DeactivateMetricSet!\n");
        return;
    }

    TCompletionCode res = m_MetricSet->Deactivate();
    if( res != CC_OK ) { DebugPrint("DeactivateMetricSet failed!\n"); }

    m_Activated = res != CC_OK;
}